

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

bool __thiscall QStyleSheetStyle::hasStyleRule(QStyleSheetStyle *this,QObject *obj,int part)

{
  Span *pSVar1;
  bool bVar2;
  int iVar3;
  QStyleSheetStyle *this_00;
  long lVar4;
  bool *pbVar5;
  ulong uVar6;
  uchar uVar7;
  QStyleSheetStyle *this_01;
  long in_FS_OFFSET;
  const_iterator cVar8;
  QStringView other;
  QArrayDataPointer<char16_t> local_88;
  QLatin1String local_70;
  QArrayDataPointer<QCss::StyleRule> local_60;
  int part_local;
  QObject *obj_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  part_local = part;
  obj_local = obj;
  this_00 = (QStyleSheetStyle *)
            QHash<const_QObject_*,_QHash<int,_bool>_>::operator[]
                      (&styleSheetCaches->hasStyleRuleCache,&obj_local);
  this_01 = this_00;
  cVar8 = QHash<int,_bool>::constFindImpl<int>((QHash<int,_bool> *)this_00,&part_local);
  if (cVar8.i.d == (Data<QHashPrivate::Node<int,_bool>_> *)0x0 && cVar8.i.bucket == 0) {
    bVar2 = initObject(this_01,obj_local);
    if (bVar2) {
      styleRules((QList<QCss::StyleRule> *)&local_60,this,obj_local);
      lVar4 = (long)part_local;
      if (lVar4 == 0) {
        uVar7 = obj_local != (QObject *)0x0 && local_60.size != 0;
        pbVar5 = QHash<int,_bool>::operator[]((QHash<int,_bool> *)this_00,&part_local);
        *pbVar5 = (bool)uVar7;
      }
      else {
        local_70.m_size = QtPrivate::lengthHelperPointer<char>(knownPseudoElements[lVar4].name);
        uVar6 = 0xffffffffffffffff;
        local_70.m_data = knownPseudoElements[lVar4].name;
        do {
          uVar6 = uVar6 + 1;
          uVar7 = uVar6 < (ulong)local_60.size;
          if ((ulong)local_60.size <= uVar6) {
            bVar2 = false;
            goto LAB_00342b74;
          }
          QCss::Selector::pseudoElement();
          other.m_data = local_88.ptr;
          other.m_size = local_88.size;
          iVar3 = QLatin1String::compare(&local_70,other,CaseInsensitive);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        } while (iVar3 != 0);
        bVar2 = true;
LAB_00342b74:
        pbVar5 = QHash<int,_bool>::operator[]((QHash<int,_bool> *)this_00,&part_local);
        *pbVar5 = bVar2;
      }
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_60);
    }
    else {
      uVar7 = '\0';
    }
  }
  else {
    pSVar1 = (cVar8.i.d)->spans;
    uVar6 = cVar8.i.bucket >> 7;
    uVar7 = pSVar1[uVar6].entries[pSVar1[uVar6].offsets[(uint)cVar8.i.bucket & 0x7f]].storage.data
            [4];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyleSheetStyle::hasStyleRule(const QObject *obj, int part) const
{
    QHash<int, bool> &cache = styleSheetCaches->hasStyleRuleCache[obj];
    QHash<int, bool>::const_iterator cacheIt = cache.constFind(part);
    if (cacheIt != cache.constEnd())
        return cacheIt.value();

    if (!initObject(obj))
        return false;

    const QList<StyleRule> &rules = styleRules(obj);
    if (part == PseudoElement_None) {
        bool result = obj && !rules.isEmpty();
        cache[part] = result;
        return result;
    }

    auto pseudoElement = QLatin1StringView(knownPseudoElements[part].name);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        if (pseudoElement.compare(selector.pseudoElement(), Qt::CaseInsensitive) == 0) {
            cache[part] = true;
            return true;
        }
    }

    cache[part] = false;
    return false;
}